

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fBufferCopyTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::BufferCopyTests::init(BufferCopyTests *this,EVP_PKEY_CTX *ctx)

{
  deUint32 dVar1;
  deUint32 target;
  TestNode *pTVar2;
  char *pcVar3;
  BasicBufferCopyCase *pBVar4;
  TestNode *pTVar5;
  undefined8 extraout_RAX;
  SingleBufferCopyCase *this_00;
  undefined8 uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  allocator<char> local_b1;
  TestNode *local_b0;
  long local_a8;
  TestNode *local_a0;
  long local_98;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"basic",
             "Basic buffer copy cases");
  local_b0 = (TestNode *)this;
  local_a0 = pTVar2;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  lVar8 = 0;
  for (lVar7 = 0; lVar7 != 8; lVar7 = lVar7 + 1) {
    local_a8 = lVar8;
    local_98 = lVar7;
    for (lVar9 = 0; lVar9 != 0x20; lVar9 = lVar9 + 4) {
      if (lVar8 != lVar9) {
        dVar1 = init::bufferTargets[lVar7];
        target = *(deUint32 *)((long)init::bufferTargets + lVar9);
        pcVar3 = deqp::gls::BufferTestUtil::getBufferTargetName(dVar1);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,pcVar3,&local_b1);
        std::operator+(&local_50,&local_70,"_");
        pcVar3 = deqp::gls::BufferTestUtil::getBufferTargetName(target);
        std::operator+(&name,&local_50,pcVar3);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_70);
        pBVar4 = (BasicBufferCopyCase *)operator_new(0xe8);
        BasicBufferCopyCase::BasicBufferCopyCase
                  (pBVar4,(Context *)local_b0[1]._vptr_TestNode,name._M_dataplus._M_p,
                   glcts::fixed_sample_locations_values + 1,dVar1,0x3f9,0x88e4,target,0x3f9,0x88e4,0
                   ,0,0x3f9,VERIFY_AS_VERTEX_ARRAY);
        tcu::TestNode::addChild(local_a0,(TestNode *)pBVar4);
        std::__cxx11::string::~string((string *)&name);
        lVar7 = local_98;
        lVar8 = local_a8;
      }
    }
    lVar8 = lVar8 + 4;
  }
  pTVar5 = (TestNode *)operator_new(0x70);
  pTVar2 = local_b0;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,local_b0->m_testCtx,"subrange","Buffer subrange copy tests");
  tcu::TestNode::addChild(pTVar2,pTVar5);
  for (lVar7 = 0x18; lVar7 != 0xf8; lVar7 = lVar7 + 0x20) {
    pBVar4 = (BasicBufferCopyCase *)operator_new(0xe8);
    BasicBufferCopyCase::BasicBufferCopyCase
              (pBVar4,(Context *)local_b0[1]._vptr_TestNode,
               *(char **)((long)&PTR_deinit_01e42918 + lVar7),
               glcts::fixed_sample_locations_values + 1,0x8f36,
               *(int *)((long)&PTR_iterate_01e42920 + lVar7),0x88e4,0x8f37,
               *(int *)((long)&PTR_iterate_01e42920 + lVar7 + 4),0x88e4,
               *(int *)(&UNK_01e42928 + lVar7),*(int *)(&UNK_01e4292c + lVar7),
               *(int *)((long)&init::cases[0].name + lVar7),VERIFY_AS_VERTEX_ARRAY);
    tcu::TestNode::addChild(pTVar5,(TestNode *)pBVar4);
  }
  pTVar5 = (TestNode *)operator_new(0x70);
  pTVar2 = local_b0;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,local_b0->m_testCtx,"single_buffer",
             "Copies within single buffer");
  local_a0 = pTVar5;
  tcu::TestNode::addChild(pTVar2,pTVar5);
  lVar8 = 0;
  uVar6 = extraout_RAX;
  for (lVar7 = 0; lVar7 != 8; lVar7 = lVar7 + 1) {
    local_98 = lVar7;
    for (lVar9 = 0; lVar9 != 0x20; lVar9 = lVar9 + 4) {
      if (lVar8 != lVar9) {
        dVar1 = init::bufferTargets[lVar7];
        local_a8 = CONCAT44(local_a8._4_4_,*(undefined4 *)((long)init::bufferTargets + lVar9));
        pcVar3 = deqp::gls::BufferTestUtil::getBufferTargetName(dVar1);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,pcVar3,&local_b1);
        std::operator+(&local_50,&local_70,"_");
        pcVar3 = deqp::gls::BufferTestUtil::getBufferTargetName((deUint32)local_a8);
        std::operator+(&name,&local_50,pcVar3);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_70);
        this_00 = (SingleBufferCopyCase *)operator_new(0xd0);
        SingleBufferCopyCase::SingleBufferCopyCase
                  (this_00,(Context *)local_b0[1]._vptr_TestNode,name._M_dataplus._M_p,
                   glcts::fixed_sample_locations_values + 1,dVar1,(deUint32)local_a8,0x88e4,
                   VERIFY_AS_VERTEX_ARRAY);
        tcu::TestNode::addChild(local_a0,(TestNode *)this_00);
        uVar6 = std::__cxx11::string::~string((string *)&name);
        lVar7 = local_98;
      }
    }
    lVar8 = lVar8 + 4;
  }
  return (int)uVar6;
}

Assistant:

void BufferCopyTests::init (void)
{
	static const deUint32 bufferTargets[] =
	{
		GL_ARRAY_BUFFER,
		GL_COPY_READ_BUFFER,
		GL_COPY_WRITE_BUFFER,
		GL_ELEMENT_ARRAY_BUFFER,
		GL_PIXEL_PACK_BUFFER,
		GL_PIXEL_UNPACK_BUFFER,
		GL_TRANSFORM_FEEDBACK_BUFFER,
		GL_UNIFORM_BUFFER
	};

	// .basic
	{
		tcu::TestCaseGroup* basicGroup = new tcu::TestCaseGroup(m_testCtx, "basic", "Basic buffer copy cases");
		addChild(basicGroup);

		for (int srcTargetNdx = 0; srcTargetNdx < DE_LENGTH_OF_ARRAY(bufferTargets); srcTargetNdx++)
		{
			for (int dstTargetNdx = 0; dstTargetNdx < DE_LENGTH_OF_ARRAY(bufferTargets); dstTargetNdx++)
			{
				if (srcTargetNdx == dstTargetNdx)
					continue;

				deUint32		srcTarget		= bufferTargets[srcTargetNdx];
				deUint32		dstTarget		= bufferTargets[dstTargetNdx];
				const int		size			= 1017;
				const deUint32	hint			= GL_STATIC_DRAW;
				VerifyType		verify			= VERIFY_AS_VERTEX_ARRAY;
				string			name			= string(getBufferTargetName(srcTarget)) + "_" + getBufferTargetName(dstTarget);

				basicGroup->addChild(new BasicBufferCopyCase(m_context, name.c_str(), "", srcTarget, size, hint, dstTarget, size, hint, 0, 0, size, verify));
			}
		}
	}

	// .subrange
	{
		tcu::TestCaseGroup* subrangeGroup = new tcu::TestCaseGroup(m_testCtx, "subrange", "Buffer subrange copy tests");
		addChild(subrangeGroup);

		static const struct
		{
			const char*		name;
			int				srcSize;
			int				dstSize;
			int				srcOffset;
			int				dstOffset;
			int				copySize;
		} cases[] =
		{
			//						srcSize		dstSize		srcOffs		dstOffs		copySize
			{ "middle",				1000,		1000,		250,		250,		500 },
			{ "small_to_large",		100,		1000,		0,			409,		100 },
			{ "large_to_small",		1000,		100,		409,		0,			100 },
			{ "low_to_high_1",		1000,		1000,		0,			500,		500 },
			{ "low_to_high_2",		997,		1027,		0,			701,		111 },
			{ "high_to_low_1",		1000,		1000,		500,		0,			500 },
			{ "high_to_low_2",		1027,		997,		701,		17,			111 }
		};

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(cases); ndx++)
		{
			deUint32		srcTarget		= GL_COPY_READ_BUFFER;
			deUint32		dstTarget		= GL_COPY_WRITE_BUFFER;
			deUint32		hint			= GL_STATIC_DRAW;
			VerifyType		verify			= VERIFY_AS_VERTEX_ARRAY;

			subrangeGroup->addChild(new BasicBufferCopyCase(m_context, cases[ndx].name, "",
															srcTarget, cases[ndx].srcSize, hint,
															dstTarget, cases[ndx].dstSize, hint,
															cases[ndx].srcOffset, cases[ndx].dstOffset, cases[ndx].copySize,
															verify));
		}
	}

	// .single_buffer
	{
		tcu::TestCaseGroup* singleBufGroup = new tcu::TestCaseGroup(m_testCtx, "single_buffer", "Copies within single buffer");
		addChild(singleBufGroup);

		for (int srcTargetNdx = 0; srcTargetNdx < DE_LENGTH_OF_ARRAY(bufferTargets); srcTargetNdx++)
		{
			for (int dstTargetNdx = 0; dstTargetNdx < DE_LENGTH_OF_ARRAY(bufferTargets); dstTargetNdx++)
			{
				if (srcTargetNdx == dstTargetNdx)
					continue;

				deUint32		srcTarget		= bufferTargets[srcTargetNdx];
				deUint32		dstTarget		= bufferTargets[dstTargetNdx];
				const deUint32	hint			= GL_STATIC_DRAW;
				VerifyType		verify			= VERIFY_AS_VERTEX_ARRAY;
				string			name			= string(getBufferTargetName(srcTarget)) + "_" + getBufferTargetName(dstTarget);

				singleBufGroup->addChild(new SingleBufferCopyCase(m_context, name.c_str(), "", srcTarget, dstTarget, hint, verify));
			}
		}
	}
}